

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_file.c
# Opt level: O0

int archive_write_open_FILE(archive *a,FILE *f)

{
  undefined8 *puVar1;
  undefined8 in_RSI;
  archive *in_RDI;
  archive_write_callback *unaff_retaddr;
  write_FILE_data *mine;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  puVar1 = (undefined8 *)malloc(8);
  if (puVar1 == (undefined8 *)0x0) {
    archive_set_error(in_RDI,0xc,"No memory");
    iVar2 = -0x1e;
  }
  else {
    *puVar1 = in_RSI;
    iVar2 = archive_write_open(a,f,(undefined1 *)mine,unaff_retaddr,
                               (undefined1 *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  return iVar2;
}

Assistant:

int
archive_write_open_FILE(struct archive *a, FILE *f)
{
	struct write_FILE_data *mine;

	mine = (struct write_FILE_data *)malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	mine->f = f;
	return (archive_write_open(a, mine,
		    file_open, file_write, file_close));
}